

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase60::run(TestCase60 *this)

{
  bool bVar1;
  uint64_t uVar2;
  bool local_979;
  undefined1 auStack_978 [7];
  bool _kj_shouldLog_3;
  Maybe<capnp::StructSchema::Field> local_968;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_920;
  undefined1 local_8d8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_3;
  undefined1 auStack_868 [7];
  bool _kj_shouldLog_2;
  Maybe<capnp::StructSchema::Field> local_858;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_810;
  undefined1 local_7c8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_2;
  ArrayPtr<const_char> local_750;
  Field local_740;
  Reader local_700;
  Reader local_6d0;
  Schema local_6a0;
  Schema local_698;
  Field local_690;
  Reader local_650;
  Reader local_620;
  uint16_t local_5ea;
  int local_5e8;
  bool local_5e1;
  undefined1 auStack_5e0 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_5d0;
  Field local_5c0;
  Reader local_580;
  Reader local_550;
  Schema local_520;
  Schema local_518;
  Field local_510;
  Reader local_4d0;
  Reader local_4a0;
  uint16_t local_46a;
  int local_468;
  DebugExpression<int> local_464;
  undefined1 local_460 [8];
  DebugComparison<int,_unsigned_short> _kjCondition_1;
  ArrayPtr<const_char> local_430;
  Field local_420;
  Reader local_3e0;
  Reader local_3b0;
  Schema local_380;
  Schema local_378;
  Field local_370;
  Reader local_330;
  Reader local_300;
  uint16_t local_2ca;
  int local_2c8;
  bool local_2c1;
  undefined1 auStack_2c0 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_2b0;
  Field local_2a0;
  Reader local_260;
  Reader local_230;
  Schema local_200;
  Schema local_1f8;
  Field local_1f0;
  Reader local_1b0;
  Reader local_180;
  uint16_t local_14a;
  int local_148;
  DebugExpression<int> local_144;
  undefined1 local_140 [8];
  DebugComparison<int,_unsigned_short> _kjCondition;
  Schema local_118;
  Reader local_110;
  Schema local_e0;
  Schema local_d8;
  Schema local_d0;
  Reader local_c8;
  Schema local_98 [3];
  Schema local_80;
  Reader local_78;
  Schema local_48;
  Schema local_40;
  StructSchema schema;
  SchemaLoader loader;
  TestCase60 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&schema);
  local_80.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLateUnion>();
  Schema::getProto(&local_78,&local_80);
  local_48 = SchemaLoader::load((SchemaLoader *)&schema,&local_78);
  local_40.raw = (RawBrandedSchema *)Schema::asStruct(&local_48);
  local_d0.raw = (RawBrandedSchema *)
                 Schema::from<capnproto_test::capnp::test::TestLateUnion::TheUnion>();
  Schema::getProto(&local_c8,&local_d0);
  local_98[0] = SchemaLoader::load((SchemaLoader *)&schema,&local_c8);
  local_d8.raw = (RawBrandedSchema *)Schema::asStruct(local_98);
  local_118.raw =
       (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLateUnion::AnotherUnion>();
  Schema::getProto(&local_110,&local_118);
  local_e0 = SchemaLoader::load((SchemaLoader *)&schema,&local_110);
  _kjCondition._24_8_ = Schema::asStruct(&local_e0);
  local_148 = 6;
  local_144 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_148);
  kj::StringPtr::StringPtr((StringPtr *)&local_2b0,"theUnion");
  StructSchema::getFieldByName(&local_2a0,(StructSchema *)&local_40,(StringPtr)local_2b0);
  StructSchema::Field::getProto(&local_260,&local_2a0);
  capnp::schema::Field::Reader::getGroup(&local_230,&local_260);
  uVar2 = capnp::schema::Field::Group::Reader::getTypeId(&local_230);
  local_200 = Schema::getDependency(&local_40,uVar2);
  local_1f8.raw = (RawBrandedSchema *)Schema::asStruct(&local_200);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2c0,"grault");
  StructSchema::getFieldByName(&local_1f0,(StructSchema *)&local_1f8,(StringPtr)_auStack_2c0);
  StructSchema::Field::getProto(&local_1b0,&local_1f0);
  capnp::schema::Field::Reader::getOrdinal(&local_180,&local_1b0);
  local_14a = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_180);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_short> *)local_140,&local_144,&local_14a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      local_2c8 = 6;
      kj::StringPtr::StringPtr((StringPtr *)&local_430,"theUnion");
      StructSchema::getFieldByName(&local_420,(StructSchema *)&local_40,(StringPtr)local_430);
      StructSchema::Field::getProto(&local_3e0,&local_420);
      capnp::schema::Field::Reader::getGroup(&local_3b0,&local_3e0);
      uVar2 = capnp::schema::Field::Group::Reader::getTypeId(&local_3b0);
      local_380 = Schema::getDependency(&local_40,uVar2);
      local_378.raw = (RawBrandedSchema *)Schema::asStruct(&local_380);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_1.result,"grault");
      StructSchema::getFieldByName
                (&local_370,(StructSchema *)&local_378,(StringPtr)stack0xfffffffffffffbc0);
      StructSchema::Field::getProto(&local_330,&local_370);
      capnp::schema::Field::Reader::getOrdinal(&local_300,&local_330);
      local_2ca = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_300);
      kj::_::Debug::
      log<char_const(&)[191],kj::_::DebugComparison<int,unsigned_short>&,int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x46,ERROR,
                 "\"failed: expected \" \"(6) == (schema.getDependency(schema.getFieldByName(\\\"theUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"grault\\\").getProto().getOrdinal().getExplicit())\", _kjCondition, 6, schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit()"
                 ,(char (*) [191])
                  "failed: expected (6) == (schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit())"
                 ,(DebugComparison<int,_unsigned_short> *)local_140,&local_2c8,&local_2ca);
      local_2c1 = false;
    }
  }
  local_468 = 9;
  local_464 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_468);
  kj::StringPtr::StringPtr((StringPtr *)&local_5d0,"anotherUnion");
  StructSchema::getFieldByName(&local_5c0,(StructSchema *)&local_40,(StringPtr)local_5d0);
  StructSchema::Field::getProto(&local_580,&local_5c0);
  capnp::schema::Field::Reader::getGroup(&local_550,&local_580);
  uVar2 = capnp::schema::Field::Group::Reader::getTypeId(&local_550);
  local_520 = Schema::getDependency(&local_40,uVar2);
  local_518.raw = (RawBrandedSchema *)Schema::asStruct(&local_520);
  kj::StringPtr::StringPtr((StringPtr *)auStack_5e0,"corge");
  StructSchema::getFieldByName(&local_510,(StructSchema *)&local_518,(StringPtr)_auStack_5e0);
  StructSchema::Field::getProto(&local_4d0,&local_510);
  capnp::schema::Field::Reader::getOrdinal(&local_4a0,&local_4d0);
  local_46a = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_4a0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_short> *)local_460,&local_464,&local_46a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_460);
  if (!bVar1) {
    local_5e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e1 != false) {
      local_5e8 = 9;
      kj::StringPtr::StringPtr((StringPtr *)&local_750,"anotherUnion");
      StructSchema::getFieldByName(&local_740,(StructSchema *)&local_40,(StringPtr)local_750);
      StructSchema::Field::getProto(&local_700,&local_740);
      capnp::schema::Field::Reader::getGroup(&local_6d0,&local_700);
      uVar2 = capnp::schema::Field::Group::Reader::getTypeId(&local_6d0);
      local_6a0 = Schema::getDependency(&local_40,uVar2);
      local_698.raw = (RawBrandedSchema *)Schema::asStruct(&local_6a0);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_2.result,"corge");
      StructSchema::getFieldByName
                (&local_690,(StructSchema *)&local_698,(StringPtr)stack0xfffffffffffff8a0);
      StructSchema::Field::getProto(&local_650,&local_690);
      capnp::schema::Field::Reader::getOrdinal(&local_620,&local_650);
      local_5ea = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_620);
      kj::_::Debug::
      log<char_const(&)[194],kj::_::DebugComparison<int,unsigned_short>&,int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"(9) == (schema.getDependency(schema.getFieldByName(\\\"anotherUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"corge\\\").getProto().getOrdinal().getExplicit())\", _kjCondition, 9, schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit()"
                 ,(char (*) [194])
                  "failed: expected (9) == (schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit())"
                 ,(DebugComparison<int,_unsigned_short> *)local_460,&local_5e8,&local_5ea);
      local_5e1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_868,"corge");
  StructSchema::findFieldByName(&local_858,(StructSchema *)&local_40,(StringPtr)_auStack_868);
  kj::_::DebugExpressionStart::operator<<
            (&local_810,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_858);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_7c8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_810,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_810);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_858);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7c8);
  if (!bVar1) {
    _kjCondition_3._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"corge\\\") == kj::none\", _kjCondition"
                 ,(char (*) [61])"failed: expected schema.findFieldByName(\"corge\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_7c8);
      _kjCondition_3._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_7c8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_978,"grault");
  StructSchema::findFieldByName(&local_968,(StructSchema *)&local_40,(StringPtr)_auStack_978);
  kj::_::DebugExpressionStart::operator<<
            (&local_920,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_968);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_8d8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_920,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_920);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_968);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d8);
  if (!bVar1) {
    local_979 = kj::_::Debug::shouldLog(ERROR);
    while (local_979 != false) {
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"grault\\\") == kj::none\", _kjCondition"
                 ,(char (*) [62])"failed: expected schema.findFieldByName(\"grault\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_8d8);
      local_979 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_8d8);
  SchemaLoader::~SchemaLoader((SchemaLoader *)&schema);
  return;
}

Assistant:

TEST(SchemaLoader, LoadLateUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestLateUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::TheUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::AnotherUnion>().getProto()).asStruct();

  EXPECT_EQ(6,
      schema.getDependency(schema.getFieldByName("theUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(9,
      schema.getDependency(schema.getFieldByName("anotherUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_TRUE(schema.findFieldByName("corge") == kj::none);
  EXPECT_TRUE(schema.findFieldByName("grault") == kj::none);
}